

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::ImageSizeMachine::CheckProgram(ImageSizeMachine *this,GLuint program)

{
  void *pvVar1;
  char *format;
  long lVar2;
  CallLogWrapper *this_00;
  bool bVar3;
  GLint length_1;
  GLint attached_shaders;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  GLenum type;
  GLint length;
  GLint status;
  int local_7c;
  int local_78;
  allocator_type local_71;
  vector<char,_std::allocator<char>_> local_70;
  int local_54;
  vector<char,_std::allocator<char>_> local_50;
  int local_34;
  
  if (program == 0) {
    bVar3 = true;
  }
  else {
    this_00 = &(this->super_GLWrapper).super_CallLogWrapper;
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_34);
    if (local_34 == 0) {
      glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b85,&local_78);
      if (0 < (long)local_78) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,(long)local_78,
                   (allocator_type *)&local_50);
        glu::CallLogWrapper::glGetAttachedShaders
                  (this_00,program,local_78,(GLsizei *)0x0,
                   (GLuint *)
                   local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        if (0 < local_78) {
          lVar2 = 0;
          do {
            glu::CallLogWrapper::glGetShaderiv
                      (this_00,*(GLuint *)
                                ((long)local_70.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b4f,
                       &local_54);
            if (local_54 < 0x8e87) {
              if (local_54 == 0x8b30) {
                format = "*** Fragment Shader ***\n";
              }
              else {
                format = "*** Vertex Shader ***\n";
                if (local_54 != 0x8b31) {
                  if (local_54 == 0x8dd9) {
                    format = "*** Geometry Shader ***\n";
                  }
                  else {
LAB_00a1cd54:
                    format = "*** Unknown Shader ***\n";
                  }
                }
              }
            }
            else if (local_54 == 0x8e87) {
              format = "*** Tessellation Evaluation Shader ***\n";
            }
            else if (local_54 == 0x8e88) {
              format = "*** Tessellation Control Shader ***\n";
            }
            else {
              if (local_54 != 0x91b9) goto LAB_00a1cd54;
              format = "*** Compute Shader ***\n";
            }
            anon_unknown_0::Output(format);
            glu::CallLogWrapper::glGetShaderiv
                      (this_00,*(GLuint *)
                                ((long)local_70.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b88,
                       &local_7c);
            if (0 < (long)local_7c) {
              std::vector<char,_std::allocator<char>_>::vector(&local_50,(long)local_7c,&local_71);
              glu::CallLogWrapper::glGetShaderSource
                        (this_00,*(GLuint *)
                                  ((long)local_70.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),
                         local_7c,(GLsizei *)0x0,
                         (GLchar *)
                         CONCAT44(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)local_50.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start));
              anon_unknown_0::Output
                        ("%s\n",CONCAT44(local_50.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_50.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start));
              pvVar1 = (void *)CONCAT44(local_50.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        (int)local_50.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_start);
              if (pvVar1 != (void *)0x0) {
                operator_delete(pvVar1,(long)local_50.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_end_of_storage -
                                       (long)pvVar1);
              }
            }
            glu::CallLogWrapper::glGetShaderiv
                      (this_00,*(GLuint *)
                                ((long)local_70.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b84,
                       &local_7c);
            if (0 < (long)local_7c) {
              std::vector<char,_std::allocator<char>_>::vector(&local_50,(long)local_7c,&local_71);
              glu::CallLogWrapper::glGetShaderInfoLog
                        (this_00,*(GLuint *)
                                  ((long)local_70.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),
                         local_7c,(GLsizei *)0x0,
                         (GLchar *)
                         CONCAT44(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)local_50.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start));
              anon_unknown_0::Output
                        ("%s\n",CONCAT44(local_50.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_50.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start));
              pvVar1 = (void *)CONCAT44(local_50.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        (int)local_50.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_start);
              if (pvVar1 != (void *)0x0) {
                operator_delete(pvVar1,(long)local_50.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_end_of_storage -
                                       (long)pvVar1);
              }
            }
            lVar2 = lVar2 + 1;
          } while (lVar2 < local_78);
        }
        if ((GLuint *)
            local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start != (GLuint *)0x0) {
          operator_delete(local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b84,(GLint *)&local_50);
      if (0 < (long)(int)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start) {
        std::vector<char,_std::allocator<char>_>::vector
                  (&local_70,
                   (long)(int)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,(allocator_type *)&local_54);
        glu::CallLogWrapper::glGetProgramInfoLog
                  (this_00,program,
                   (int)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,(GLsizei *)0x0,
                   local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        anon_unknown_0::Output
                  ("%s\n",local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        if ((GLuint *)
            local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start != (GLuint *)0x0) {
          operator_delete(local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
    }
    bVar3 = local_34 == 1;
  }
  return bVar3;
}

Assistant:

bool CheckProgram(GLuint program)
	{
		if (program == 0)
			return true;
		GLint status;
		glGetProgramiv(program, GL_LINK_STATUS, &status);

		if (status == GL_FALSE)
		{
			GLint attached_shaders;
			glGetProgramiv(program, GL_ATTACHED_SHADERS, &attached_shaders);

			if (attached_shaders > 0)
			{
				std::vector<GLuint> shaders(attached_shaders);
				glGetAttachedShaders(program, attached_shaders, NULL, &shaders[0]);

				for (GLint i = 0; i < attached_shaders; ++i)
				{
					GLenum type;
					glGetShaderiv(shaders[i], GL_SHADER_TYPE, reinterpret_cast<GLint*>(&type));
					switch (type)
					{
					case GL_VERTEX_SHADER:
						Output("*** Vertex Shader ***\n");
						break;
					case GL_TESS_CONTROL_SHADER:
						Output("*** Tessellation Control Shader ***\n");
						break;
					case GL_TESS_EVALUATION_SHADER:
						Output("*** Tessellation Evaluation Shader ***\n");
						break;
					case GL_GEOMETRY_SHADER:
						Output("*** Geometry Shader ***\n");
						break;
					case GL_FRAGMENT_SHADER:
						Output("*** Fragment Shader ***\n");
						break;
					case GL_COMPUTE_SHADER:
						Output("*** Compute Shader ***\n");
						break;
					default:
						Output("*** Unknown Shader ***\n");
						break;
					}
					GLint length;
					glGetShaderiv(shaders[i], GL_SHADER_SOURCE_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> source(length);
						glGetShaderSource(shaders[i], length, NULL, &source[0]);
						Output("%s\n", &source[0]);
					}
					glGetShaderiv(shaders[i], GL_INFO_LOG_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> log(length);
						glGetShaderInfoLog(shaders[i], length, NULL, &log[0]);
						Output("%s\n", &log[0]);
					}
				}
			}
			GLint length;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
			if (length > 0)
			{
				std::vector<GLchar> log(length);
				glGetProgramInfoLog(program, length, NULL, &log[0]);
				Output("%s\n", &log[0]);
			}
		}
		return status == GL_TRUE ? true : false;
	}